

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O3

void test_chain_constructors<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true>>>
               (void)

{
  uint uVar1;
  long *plVar2;
  _Hash_node_base *p_Var3;
  undefined8 *puVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  pool<boost::default_user_allocator_malloc_free> *ppVar15;
  pool<boost::default_user_allocator_malloc_free> *ppVar16;
  undefined1 auVar17 [8];
  undefined1 auVar18 [8];
  Column_settings *pCVar19;
  Column_settings *pCVar20;
  ulong uVar21;
  int local_9ec;
  undefined8 local_9e8;
  undefined4 *local_9e0;
  undefined4 ****local_9d8;
  char *local_9d0;
  shared_count sStack_9c8;
  undefined8 *local_9c0;
  undefined **local_9b8;
  char *local_9b0;
  undefined8 *local_9a8;
  undefined4 **local_9a0;
  undefined4 local_994;
  undefined4 **local_990;
  char *local_988;
  undefined8 local_980;
  char *local_978;
  shared_count sStack_970;
  undefined4 ***local_968;
  ulong local_960;
  shared_count sStack_958;
  char *local_950;
  pool<boost::default_user_allocator_malloc_free> *local_948;
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>
  CStack_940;
  undefined1 local_828 [8];
  undefined1 auStack_820 [40];
  undefined8 uStack_7f8;
  _Manager_type local_7f0;
  _Invoker_type p_Stack_7e8;
  void *local_7e0;
  undefined8 uStack_7d8;
  _Manager_type local_7d0;
  _Invoker_type p_Stack_7c8;
  pointer local_7c0;
  pointer pvStack_7b8;
  pointer local_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  pointer local_798;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_790;
  void *local_758;
  long local_750;
  undefined8 *local_748;
  undefined8 uStack_740;
  Index local_720;
  pool<boost::default_user_allocator_malloc_free> *local_718;
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
  mc1;
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
  mr;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ordered_boundaries;
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
  mc2;
  char *local_398;
  char *local_390;
  undefined1 *local_388;
  undefined1 *local_380;
  char *local_378;
  char *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  char *local_358;
  char *local_350;
  undefined1 *local_348;
  undefined1 *local_340;
  char *local_338;
  char *local_330;
  undefined1 *local_328;
  undefined1 *local_320;
  char *local_318;
  char *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  char *local_2f8;
  char *local_2f0;
  undefined1 *local_2e8;
  undefined1 *local_2e0;
  char *local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  char *local_2b8;
  char *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  char *local_298;
  char *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  char *local_278;
  char *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  char *local_258;
  char *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  char *local_238;
  char *local_230;
  undefined1 *local_228;
  undefined1 *local_220;
  char *local_218;
  char *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  char *local_1d8;
  char *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  char *local_178;
  char *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  char *local_158;
  char *local_150;
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
  m;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true>>>>
            ();
  auStack_820._0_8_ = 0;
  local_828 = (undefined1  [8])birth_comp;
  auStack_820._16_8_ =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_invoke;
  auStack_820._8_8_ =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_manager;
  mr.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  mr.colSettings_ = (Column_settings *)death_comp;
  mr.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)std::
                _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>
                ::_M_invoke;
  mr.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)std::
                       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>
                       ::_M_manager;
  m.colSettings_ = (Column_settings *)operator_new(0x38);
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.ptr = (char *)0x0;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.sz = 0;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.requested_size = 0x18;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.next_size = 0x20;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.start_size = 0x20;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.max_size = 0;
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true>>>
  ::
  Chain_matrix<std::function<bool(unsigned_int,unsigned_int)>,std::function<bool(unsigned_int,unsigned_int)>>
            ((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true>>>
              *)&m.matrix_,m.colSettings_,(function<bool_(unsigned_int,_unsigned_int)> *)local_828,
             (function<bool_(unsigned_int,_unsigned_int)> *)&mr);
  if (mr.matrix_.super_Matrix_dimension_option.dimensions_.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    (*(code *)mr.matrix_.super_Matrix_dimension_option.dimensions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish)(&mr,&mr,3);
  }
  if ((_Manager_type)auStack_820._8_8_ != (_Manager_type)0x0) {
    (*(code *)auStack_820._8_8_)((_Any_data *)local_828,(_Any_data *)local_828,__destroy_functor);
  }
  local_158 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_150 = "";
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_158,0x15f);
  mc1.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)mc1.matrix_.super_Matrix_dimension_option.dimensions_.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  mc1.colSettings_ = (Column_settings *)&PTR__lazy_ostream_0024fee0;
  mc1.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)&boost::unit_test::lazy_ostream::inst;
  mc1.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x209297;
  local_9d8 = &local_968;
  local_968 = (undefined4 ***)CONCAT44(local_968._4_4_,(int)m.matrix_.matrix_._M_h._M_element_count)
  ;
  local_9b8 = (undefined **)&local_980;
  mc2.colSettings_ =
       (Column_settings *)
       CONCAT71(mc2.colSettings_._1_7_,(int)m.matrix_.matrix_._M_h._M_element_count == 0);
  local_980 = (char *)((ulong)local_980._4_4_ << 0x20);
  mc2.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  mc2.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_948 = (pool<boost::default_user_allocator_malloc_free> *)0x209319;
  CStack_940.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x20938c;
  auStack_820._16_8_ = &local_9d8;
  auStack_820._0_8_ = auStack_820._0_8_ & 0xffffffffffffff00;
  local_828 = (undefined1  [8])&PTR__lazy_ostream_0024fe50;
  auStack_820._8_8_ = &boost::unit_test::lazy_ostream::inst;
  mr.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)mr.matrix_.super_Matrix_dimension_option.dimensions_.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  mr.colSettings_ = (Column_settings *)&PTR__lazy_ostream_0024fea0;
  mr.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)&boost::unit_test::lazy_ostream::inst;
  mr.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&local_9b8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             ((long)&mc2.matrix_.super_Matrix_dimension_option.dimensions_.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data + 8));
  mr.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  mr.colSettings_ = (Column_settings *)birth_comp;
  mr.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)std::
                _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>
                ::_M_invoke;
  mr.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)std::
                       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>
                       ::_M_manager;
  mc1.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  mc1.colSettings_ = (Column_settings *)death_comp;
  mc1.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)std::
                _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>
                ::_M_invoke;
  mc1.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)std::
                       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>
                       ::_M_manager;
  local_828 = (undefined1  [8])operator_new(0x38);
  (((Entry_constructor *)
   &((pool<boost::default_user_allocator_malloc_free> *)local_828)->
    super_simple_segregated_storage<unsigned_long>)->entryPool_).
  super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  (((pool<boost::default_user_allocator_malloc_free> *)local_828)->list).ptr = (char *)0x0;
  (((pool<boost::default_user_allocator_malloc_free> *)local_828)->list).sz = 0;
  ((pool<boost::default_user_allocator_malloc_free> *)local_828)->requested_size = 0x18;
  ((pool<boost::default_user_allocator_malloc_free> *)local_828)->next_size = 0x20;
  ((pool<boost::default_user_allocator_malloc_free> *)local_828)->start_size = 0x20;
  ((pool<boost::default_user_allocator_malloc_free> *)local_828)->max_size = 0;
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true>>>
  ::
  Chain_matrix<std::function<bool(unsigned_int,unsigned_int)>,std::function<bool(unsigned_int,unsigned_int)>,std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true>>>
              *)(local_828 + 8),&ordered_boundaries,(Column_settings *)local_828,
             (function<bool_(unsigned_int,_unsigned_int)> *)&mr,
             (function<bool_(unsigned_int,_unsigned_int)> *)&mc1);
  if (mc1.matrix_.super_Matrix_dimension_option.dimensions_.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    (*(code *)mc1.matrix_.super_Matrix_dimension_option.dimensions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish)(&mc1,&mc1,3);
  }
  if (mr.matrix_.super_Matrix_dimension_option.dimensions_.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    (*(code *)mr.matrix_.super_Matrix_dimension_option.dimensions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish)(&mr,&mr,3);
  }
  local_178 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_170 = "";
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_178,0x163);
  mc2.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)mc2.matrix_.super_Matrix_dimension_option.dimensions_.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  mc2.colSettings_ = (Column_settings *)&PTR__lazy_ostream_0024fee0;
  mc2.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)&boost::unit_test::lazy_ostream::inst;
  mc2.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x209297;
  local_968 = &local_990;
  local_990._0_4_ = 7;
  CStack_940.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  CStack_940.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_9d8 = (undefined4 ****)0x209319;
  local_9d0 = "";
  local_9b8 = (undefined **)&local_980;
  mr.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)mr.matrix_.super_Matrix_dimension_option.dimensions_.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  mr.colSettings_ = (Column_settings *)&PTR__lazy_ostream_0024fe50;
  mr.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)&boost::unit_test::lazy_ostream::inst;
  mc1.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)mc1.matrix_.super_Matrix_dimension_option.dimensions_.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  mc1.colSettings_ = (Column_settings *)&PTR__lazy_ostream_0024fea0;
  mc1.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)&boost::unit_test::lazy_ostream::inst;
  mc1.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&local_968;
  mr.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&local_9b8;
  local_948._0_1_ = (int)local_790._M_element_count == 7;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             ((long)&CStack_940.super_Matrix_dimension_option.dimensions_.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data + 8));
  local_198 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_190 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_198,0x164);
  mc2.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)mc2.matrix_.super_Matrix_dimension_option.dimensions_.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  mc2.colSettings_ = (Column_settings *)&PTR__lazy_ostream_0024fee0;
  mc2.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)&boost::unit_test::lazy_ostream::inst;
  mc2.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x209297;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_790._M_bucket_count;
  uVar21 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(2)) % auVar5,0);
  plVar2 = *(long **)((long)local_790._M_buckets + (uVar21 & 0xffffffff) * 8);
  if (plVar2 != (long *)0x0) {
    plVar2 = (long *)*plVar2;
    uVar1 = *(uint *)(plVar2 + 1);
    do {
      if (uVar1 == 2) {
        local_980._0_4_ = *(uint *)(plVar2 + 2);
        local_990._0_4_ = 0;
        local_948._0_1_ = (uint)local_980 == 0;
        CStack_940.super_Matrix_dimension_option.dimensions_.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        CStack_940.super_Matrix_dimension_option.dimensions_.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_9d8 = (undefined4 ****)0x209319;
        local_9d0 = "";
        local_9b8 = (undefined **)&local_980;
        mr.matrix_.super_Matrix_dimension_option.dimensions_.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)((ulong)mr.matrix_.super_Matrix_dimension_option.dimensions_.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
        mr.colSettings_ = (Column_settings *)&PTR__lazy_ostream_0024fea0;
        mr.matrix_.super_Matrix_dimension_option.dimensions_.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)&boost::unit_test::lazy_ostream::inst;
        local_968 = &local_990;
        mc1.matrix_.super_Matrix_dimension_option.dimensions_.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)((ulong)mc1.matrix_.super_Matrix_dimension_option.dimensions_.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
        mc1.colSettings_ = (Column_settings *)&PTR__lazy_ostream_0024fea0;
        mc1.matrix_.super_Matrix_dimension_option.dimensions_.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)&boost::unit_test::lazy_ostream::inst;
        mc1.matrix_.super_Matrix_dimension_option.dimensions_.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)&local_968;
        mr.matrix_.super_Matrix_dimension_option.dimensions_.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)&local_9b8;
        boost::test_tools::tt_detail::report_assertion
                  (&local_948,&mc2,&local_9d8,0x164,1,2,2,"mb.get_column_dimension(2)",&mr,"0",&mc1)
        ;
        boost::detail::shared_count::~shared_count
                  ((shared_count *)
                   ((long)&CStack_940.super_Matrix_dimension_option.dimensions_.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data + 8));
        local_1b8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_1b0 = "";
        local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1b8,0x165);
        mc2.matrix_.super_Matrix_dimension_option.dimensions_.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)((ulong)mc2.matrix_.super_Matrix_dimension_option.dimensions_.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
        mc2.colSettings_ = (Column_settings *)&PTR__lazy_ostream_0024fee0;
        mc2.matrix_.super_Matrix_dimension_option.dimensions_.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)&boost::unit_test::lazy_ostream::inst;
        mc2.matrix_.super_Matrix_dimension_option.dimensions_.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x209297;
        auVar6._8_8_ = 0;
        auVar6._0_8_ = local_790._M_bucket_count;
        uVar21 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(6)) % auVar6,0);
        plVar2 = *(long **)((long)local_790._M_buckets + (uVar21 & 0xffffffff) * 8);
        if (plVar2 != (long *)0x0) {
          plVar2 = (long *)*plVar2;
          uVar1 = *(uint *)(plVar2 + 1);
          do {
            if (uVar1 == 6) {
              local_980 = (char *)CONCAT44(local_980._4_4_,(int)plVar2[2]);
              local_990 = (undefined4 **)CONCAT44(local_990._4_4_,2);
              local_948 = (pool<boost::default_user_allocator_malloc_free> *)
                          CONCAT71(local_948._1_7_,(int)plVar2[2] == 2);
              CStack_940.super_Matrix_dimension_option.dimensions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              CStack_940.super_Matrix_dimension_option.dimensions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_9d8 = (undefined4 ****)0x209319;
              local_9d0 = "";
              local_9b8 = (undefined **)&local_980;
              mr.matrix_.super_Matrix_dimension_option.dimensions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)((ulong)mr.matrix_.super_Matrix_dimension_option.dimensions_.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
              mr.colSettings_ = (Column_settings *)&PTR__lazy_ostream_0024fea0;
              mr.matrix_.super_Matrix_dimension_option.dimensions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)&boost::unit_test::lazy_ostream::inst;
              local_968 = &local_990;
              mc1.matrix_.super_Matrix_dimension_option.dimensions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)((ulong)mc1.matrix_.super_Matrix_dimension_option.dimensions_.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
              mc1.colSettings_ = (Column_settings *)&PTR__lazy_ostream_0024fea0;
              mc1.matrix_.super_Matrix_dimension_option.dimensions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)&boost::unit_test::lazy_ostream::inst;
              mc1.matrix_.super_Matrix_dimension_option.dimensions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)&local_968;
              mr.matrix_.super_Matrix_dimension_option.dimensions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)&local_9b8;
              boost::test_tools::tt_detail::report_assertion
                        (&local_948,&mc2,&local_9d8,0x165,1,2,2,"mb.get_column_dimension(6)",&mr,"2"
                         ,&mc1);
              boost::detail::shared_count::~shared_count
                        ((shared_count *)
                         ((long)&CStack_940.super_Matrix_dimension_option.dimensions_.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data + 8));
              mc1.matrix_.super_Matrix_dimension_option.dimensions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              mc1.colSettings_ = (Column_settings *)birth_comp;
              mc1.matrix_.super_Matrix_dimension_option.dimensions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   (pointer)std::
                            _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>
                            ::_M_invoke;
              mc1.matrix_.super_Matrix_dimension_option.dimensions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   (pointer)std::
                            _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>
                            ::_M_manager;
              mc2.matrix_.super_Matrix_dimension_option.dimensions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              mc2.colSettings_ = (Column_settings *)death_comp;
              mc2.matrix_.super_Matrix_dimension_option.dimensions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   (pointer)std::
                            _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>
                            ::_M_invoke;
              mc2.matrix_.super_Matrix_dimension_option.dimensions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   (pointer)std::
                            _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>
                            ::_M_manager;
              mr.colSettings_ = (Column_settings *)operator_new(0x38);
              ((mr.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.
              super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
              ((mr.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.list.ptr = (char *)0x0;
              ((mr.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.list.sz = 0;
              ((mr.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.requested_size = 0x18;
              ((mr.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.next_size = 0x20;
              ((mr.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.start_size = 0x20;
              ((mr.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.max_size = 0;
              Gudhi::persistence_matrix::
              Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true>>>
              ::
              Chain_matrix<std::function<bool(unsigned_int,unsigned_int)>,std::function<bool(unsigned_int,unsigned_int)>>
                        ((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true>>>
                          *)&mr.matrix_,5,mr.colSettings_,
                         (function<bool_(unsigned_int,_unsigned_int)> *)&mc1,
                         (function<bool_(unsigned_int,_unsigned_int)> *)&mc2);
              if (mc2.matrix_.super_Matrix_dimension_option.dimensions_.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish != (pointer)0x0) {
                (*(code *)mc2.matrix_.super_Matrix_dimension_option.dimensions_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish)(&mc2,&mc2,3);
              }
              if (mc1.matrix_.super_Matrix_dimension_option.dimensions_.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish != (pointer)0x0) {
                (*(code *)mc1.matrix_.super_Matrix_dimension_option.dimensions_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish)(&mc1,&mc1,3);
              }
              local_1d8 = 
              "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
              ;
              local_1d0 = "";
              local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
              local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1d8,0x169);
              CStack_940.super_Matrix_dimension_option.dimensions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)((ulong)CStack_940.super_Matrix_dimension_option.dimensions_.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
              local_948 = (pool<boost::default_user_allocator_malloc_free> *)
                          &PTR__lazy_ostream_0024fee0;
              CStack_940.super_Matrix_dimension_option.dimensions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)&boost::unit_test::lazy_ostream::inst;
              CStack_940.super_Matrix_dimension_option.dimensions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x209297;
              local_990 = (undefined4 **)
                          CONCAT44(local_990._4_4_,(int)mr.matrix_.matrix_._M_h._M_element_count);
              local_980 = (char *)&local_9e8;
              local_9d8 = (undefined4 ****)
                          CONCAT71(local_9d8._1_7_,
                                   (int)mr.matrix_.matrix_._M_h._M_element_count == 0);
              local_9e8 = (int *)((ulong)local_9e8._4_4_ << 0x20);
              local_9d0 = (char *)0x0;
              sStack_9c8.pi_ = (sp_counted_base *)0x0;
              local_9b8 = (undefined **)0x209319;
              local_9b0 = "";
              local_968 = &local_990;
              mc1.matrix_.super_Matrix_dimension_option.dimensions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)((ulong)mc1.matrix_.super_Matrix_dimension_option.dimensions_.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
              mc1.colSettings_ = (Column_settings *)&PTR__lazy_ostream_0024fe50;
              mc1.matrix_.super_Matrix_dimension_option.dimensions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)&boost::unit_test::lazy_ostream::inst;
              mc1.matrix_.super_Matrix_dimension_option.dimensions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)&local_968;
              mc2.matrix_.super_Matrix_dimension_option.dimensions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)((ulong)mc2.matrix_.super_Matrix_dimension_option.dimensions_.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
              mc2.colSettings_ = (Column_settings *)&PTR__lazy_ostream_0024fea0;
              mc2.matrix_.super_Matrix_dimension_option.dimensions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)&boost::unit_test::lazy_ostream::inst;
              mc2.matrix_.super_Matrix_dimension_option.dimensions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)&local_980;
              boost::test_tools::tt_detail::report_assertion
                        (&local_9d8,&local_948,&local_9b8,0x169,1,2,2,"mr.get_number_of_columns()",
                         &mc1,"0",&mc2);
              boost::detail::shared_count::~shared_count(&sStack_9c8);
              mc1.colSettings_ = (Column_settings *)operator_new(0x38);
              ((mc1.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.
              super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
              ((mc1.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.list.ptr = (char *)0x0;
              ((mc1.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.list.sz = 0;
              ((mc1.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.requested_size = 0x18;
              ((mc1.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.next_size = 0x20;
              ((mc1.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.start_size = 0x20;
              ((mc1.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.max_size = 0;
              Gudhi::persistence_matrix::
              Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>
              ::Chain_matrix(&mc1.matrix_,
                             (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>
                              *)(local_828 + 8),mc1.colSettings_);
              mc2.colSettings_ = (Column_settings *)operator_new(0x38);
              ((mc2.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.
              super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
              ((mc2.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.list.ptr = (char *)0x0;
              ((mc2.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.list.sz = 0;
              ((mc2.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.requested_size = 0x18;
              ((mc2.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.next_size = 0x20;
              ((mc2.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.start_size = 0x20;
              ((mc2.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.max_size = 0;
              Gudhi::persistence_matrix::
              Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>
              ::Chain_matrix(&mc2.matrix_,
                             (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>
                              *)(local_828 + 8),mc2.colSettings_);
              local_1f8 = 
              "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
              ;
              local_1f0 = "";
              local_208 = &boost::unit_test::basic_cstring<char_const>::null;
              local_200 = &boost::unit_test::basic_cstring<char_const>::null;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1f8,0x16e);
              local_9b0 = (char *)((ulong)local_9b0 & 0xffffffffffffff00);
              local_9b8 = &PTR__lazy_ostream_0024fee0;
              local_9a8 = &boost::unit_test::lazy_ostream::inst;
              local_9a0 = (undefined4 **)0x209297;
              local_990 = &local_9e0;
              local_9e8 = &local_9ec;
              local_9ec = 7;
              local_960 = 0;
              sStack_958.pi_ = (sp_counted_base *)0x0;
              local_980 = 
              "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
              ;
              local_978 = "";
              CStack_940.super_Matrix_dimension_option.dimensions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)((ulong)CStack_940.super_Matrix_dimension_option.dimensions_.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
              local_948 = (pool<boost::default_user_allocator_malloc_free> *)
                          &PTR__lazy_ostream_0024fe50;
              CStack_940.super_Matrix_dimension_option.dimensions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)&boost::unit_test::lazy_ostream::inst;
              CStack_940.super_Matrix_dimension_option.dimensions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)&local_990;
              local_9d0 = (char *)((ulong)local_9d0 & 0xffffffffffffff00);
              local_9d8 = (undefined4 ****)&PTR__lazy_ostream_0024fea0;
              sStack_9c8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
              local_9c0 = &local_9e8;
              local_968._0_1_ = (int)mc1.matrix_.matrix_._M_h._M_element_count == 7;
              boost::test_tools::tt_detail::report_assertion();
              boost::detail::shared_count::~shared_count(&sStack_958);
              local_218 = 
              "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
              ;
              local_210 = "";
              local_228 = &boost::unit_test::basic_cstring<char_const>::null;
              local_220 = &boost::unit_test::basic_cstring<char_const>::null;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_218,0x16f);
              local_9b0 = (char *)((ulong)local_9b0 & 0xffffffffffffff00);
              local_9b8 = &PTR__lazy_ostream_0024fee0;
              local_9a8 = &boost::unit_test::lazy_ostream::inst;
              local_9a0 = (undefined4 **)0x209297;
              auVar7._8_8_ = 0;
              auVar7._0_8_ = mc1.matrix_.matrix_._M_h._M_bucket_count;
              uVar21 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(2)) % auVar7,0);
              if (mc1.matrix_.matrix_._M_h._M_buckets[uVar21 & 0xffffffff] != (__node_base_ptr)0x0)
              {
                p_Var3 = mc1.matrix_.matrix_._M_h._M_buckets[uVar21 & 0xffffffff]->_M_nxt;
                uVar1 = *(uint *)&p_Var3[1]._M_nxt;
                do {
                  if (uVar1 == 2) {
                    local_9e0._0_4_ = *(int *)&p_Var3[2]._M_nxt;
                    local_9ec = 0;
                    local_968._0_1_ = (int)local_9e0 == 0;
                    local_960 = 0;
                    sStack_958.pi_ = (sp_counted_base *)0x0;
                    local_980 = 
                    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                    ;
                    local_978 = "";
                    local_990 = &local_9e0;
                    CStack_940.super_Matrix_dimension_option.dimensions_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start =
                         (pointer)((ulong)CStack_940.super_Matrix_dimension_option.dimensions_.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_start &
                                  0xffffffffffffff00);
                    local_948 = (pool<boost::default_user_allocator_malloc_free> *)
                                &PTR__lazy_ostream_0024fea0;
                    CStack_940.super_Matrix_dimension_option.dimensions_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish =
                         (pointer)&boost::unit_test::lazy_ostream::inst;
                    CStack_940.super_Matrix_dimension_option.dimensions_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage = (pointer)&local_990;
                    local_9e8 = &local_9ec;
                    local_9d0 = (char *)((ulong)local_9d0 & 0xffffffffffffff00);
                    local_9d8 = (undefined4 ****)&PTR__lazy_ostream_0024fea0;
                    sStack_9c8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
                    local_9c0 = &local_9e8;
                    boost::test_tools::tt_detail::report_assertion
                              (&local_968,&local_9b8,&local_980,0x16f,1,2,2,
                               "mc1.get_column_dimension(2)",&local_948,"0",&local_9d8);
                    boost::detail::shared_count::~shared_count(&sStack_958);
                    local_238 = 
                    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                    ;
                    local_230 = "";
                    local_248 = &boost::unit_test::basic_cstring<char_const>::null;
                    local_240 = &boost::unit_test::basic_cstring<char_const>::null;
                    boost::unit_test::unit_test_log_t::set_checkpoint
                              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_238,
                               0x170);
                    local_9b0 = (char *)((ulong)local_9b0 & 0xffffffffffffff00);
                    local_9b8 = &PTR__lazy_ostream_0024fee0;
                    local_9a8 = &boost::unit_test::lazy_ostream::inst;
                    local_9a0 = (undefined4 **)0x209297;
                    auVar8._8_8_ = 0;
                    auVar8._0_8_ = mc1.matrix_.matrix_._M_h._M_bucket_count;
                    uVar21 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(6)) % auVar8,0);
                    if (mc1.matrix_.matrix_._M_h._M_buckets[uVar21 & 0xffffffff] !=
                        (__node_base_ptr)0x0) {
                      p_Var3 = mc1.matrix_.matrix_._M_h._M_buckets[uVar21 & 0xffffffff]->_M_nxt;
                      uVar1 = *(uint *)&p_Var3[1]._M_nxt;
                      do {
                        if (uVar1 == 6) {
                          local_9e0._0_4_ = *(int *)&p_Var3[2]._M_nxt;
                          local_9ec = 2;
                          local_968._0_1_ = (int)local_9e0 == 2;
                          local_960 = 0;
                          sStack_958.pi_ = (sp_counted_base *)0x0;
                          local_980 = 
                          "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                          ;
                          local_978 = "";
                          local_990 = &local_9e0;
                          CStack_940.super_Matrix_dimension_option.dimensions_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start =
                               (pointer)((ulong)CStack_940.super_Matrix_dimension_option.dimensions_
                                                .
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                ._M_impl.super__Vector_impl_data._M_start &
                                        0xffffffffffffff00);
                          local_948 = (pool<boost::default_user_allocator_malloc_free> *)
                                      &PTR__lazy_ostream_0024fea0;
                          CStack_940.super_Matrix_dimension_option.dimensions_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish =
                               (pointer)&boost::unit_test::lazy_ostream::inst;
                          CStack_940.super_Matrix_dimension_option.dimensions_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage = (pointer)&local_990;
                          local_9e8 = &local_9ec;
                          local_9d0 = (char *)((ulong)local_9d0 & 0xffffffffffffff00);
                          local_9d8 = (undefined4 ****)&PTR__lazy_ostream_0024fea0;
                          sStack_9c8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
                          local_9c0 = &local_9e8;
                          boost::test_tools::tt_detail::report_assertion
                                    (&local_968,&local_9b8,&local_980,0x170,1,2,2,
                                     "mc1.get_column_dimension(6)",&local_948,"2",&local_9d8);
                          boost::detail::shared_count::~shared_count(&sStack_958);
                          local_258 = 
                          "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                          ;
                          local_250 = "";
                          local_268 = &boost::unit_test::basic_cstring<char_const>::null;
                          local_260 = &boost::unit_test::basic_cstring<char_const>::null;
                          boost::unit_test::unit_test_log_t::set_checkpoint
                                    (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                     &local_258,0x171);
                          local_9b0 = (char *)((ulong)local_9b0 & 0xffffffffffffff00);
                          local_9b8 = &PTR__lazy_ostream_0024fee0;
                          local_9a8 = &boost::unit_test::lazy_ostream::inst;
                          local_9a0 = (undefined4 **)0x209297;
                          local_968._0_1_ = (int)mc2.matrix_.matrix_._M_h._M_element_count == 7;
                          local_9ec = 7;
                          local_960 = 0;
                          sStack_958.pi_ = (sp_counted_base *)0x0;
                          local_980 = 
                          "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                          ;
                          local_978 = "";
                          local_990 = &local_9e0;
                          CStack_940.super_Matrix_dimension_option.dimensions_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start =
                               (pointer)((ulong)CStack_940.super_Matrix_dimension_option.dimensions_
                                                .
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                ._M_impl.super__Vector_impl_data._M_start &
                                        0xffffffffffffff00);
                          local_948 = (pool<boost::default_user_allocator_malloc_free> *)
                                      &PTR__lazy_ostream_0024fe50;
                          CStack_940.super_Matrix_dimension_option.dimensions_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish =
                               (pointer)&boost::unit_test::lazy_ostream::inst;
                          CStack_940.super_Matrix_dimension_option.dimensions_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage = (pointer)&local_990;
                          local_9e8 = &local_9ec;
                          local_9d0 = (char *)((ulong)local_9d0 & 0xffffffffffffff00);
                          local_9d8 = (undefined4 ****)&PTR__lazy_ostream_0024fea0;
                          sStack_9c8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
                          local_9c0 = &local_9e8;
                          boost::test_tools::tt_detail::report_assertion();
                          boost::detail::shared_count::~shared_count(&sStack_958);
                          local_278 = 
                          "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                          ;
                          local_270 = "";
                          local_288 = &boost::unit_test::basic_cstring<char_const>::null;
                          local_280 = &boost::unit_test::basic_cstring<char_const>::null;
                          boost::unit_test::unit_test_log_t::set_checkpoint
                                    (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                     &local_278,0x172);
                          local_9b0 = (char *)((ulong)local_9b0 & 0xffffffffffffff00);
                          local_9b8 = &PTR__lazy_ostream_0024fee0;
                          local_9a8 = &boost::unit_test::lazy_ostream::inst;
                          local_9a0 = (undefined4 **)0x209297;
                          auVar9._8_8_ = 0;
                          auVar9._0_8_ = mc2.matrix_.matrix_._M_h._M_bucket_count;
                          uVar21 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(2)) % auVar9,0);
                          if (mc2.matrix_.matrix_._M_h._M_buckets[uVar21 & 0xffffffff] !=
                              (__node_base_ptr)0x0) {
                            p_Var3 = mc2.matrix_.matrix_._M_h._M_buckets[uVar21 & 0xffffffff]->
                                     _M_nxt;
                            uVar1 = *(uint *)&p_Var3[1]._M_nxt;
                            do {
                              if (uVar1 == 2) {
                                local_9e0._0_4_ = *(int *)&p_Var3[2]._M_nxt;
                                local_9ec = 0;
                                local_968._0_1_ = (int)local_9e0 == 0;
                                local_960 = 0;
                                sStack_958.pi_ = (sp_counted_base *)0x0;
                                local_980 = 
                                "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                ;
                                local_978 = "";
                                local_990 = &local_9e0;
                                CStack_940.super_Matrix_dimension_option.dimensions_.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start =
                                     (pointer)((ulong)CStack_940.super_Matrix_dimension_option.
                                                      dimensions_.
                                                                                                            
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start &
                                              0xffffffffffffff00);
                                local_948 = (pool<boost::default_user_allocator_malloc_free> *)
                                            &PTR__lazy_ostream_0024fea0;
                                CStack_940.super_Matrix_dimension_option.dimensions_.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish =
                                     (pointer)&boost::unit_test::lazy_ostream::inst;
                                CStack_940.super_Matrix_dimension_option.dimensions_.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage =
                                     (pointer)&local_990;
                                local_9e8 = &local_9ec;
                                local_9d0 = (char *)((ulong)local_9d0 & 0xffffffffffffff00);
                                local_9d8 = (undefined4 ****)&PTR__lazy_ostream_0024fea0;
                                sStack_9c8.pi_ =
                                     (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
                                local_9c0 = &local_9e8;
                                boost::test_tools::tt_detail::report_assertion
                                          (&local_968,&local_9b8,&local_980,0x172,1,2,2,
                                           "mc2.get_column_dimension(2)",&local_948,"0",&local_9d8);
                                boost::detail::shared_count::~shared_count(&sStack_958);
                                local_298 = 
                                "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                ;
                                local_290 = "";
                                local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
                                local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
                                boost::unit_test::unit_test_log_t::set_checkpoint
                                          (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                           &local_298,0x173);
                                local_9b0 = (char *)((ulong)local_9b0 & 0xffffffffffffff00);
                                local_9b8 = &PTR__lazy_ostream_0024fee0;
                                local_9a8 = &boost::unit_test::lazy_ostream::inst;
                                local_9a0 = (undefined4 **)0x209297;
                                auVar10._8_8_ = 0;
                                auVar10._0_8_ = mc2.matrix_.matrix_._M_h._M_bucket_count;
                                uVar21 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(6)) % auVar10,0);
                                if (mc2.matrix_.matrix_._M_h._M_buckets[uVar21 & 0xffffffff] !=
                                    (__node_base_ptr)0x0) {
                                  p_Var3 = mc2.matrix_.matrix_._M_h._M_buckets[uVar21 & 0xffffffff]
                                           ->_M_nxt;
                                  uVar1 = *(uint *)&p_Var3[1]._M_nxt;
                                  do {
                                    if (uVar1 == 6) {
                                      local_9e0 = (undefined4 *)
                                                  CONCAT44(local_9e0._4_4_,*(int *)&p_Var3[2]._M_nxt
                                                          );
                                      local_9ec = 2;
                                      local_968 = (undefined4 ***)
                                                  CONCAT71(local_968._1_7_,
                                                           *(int *)&p_Var3[2]._M_nxt == 2);
                                      local_960 = 0;
                                      sStack_958.pi_ = (sp_counted_base *)0x0;
                                      local_980 = 
                                      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                      ;
                                      local_978 = "";
                                      local_990 = &local_9e0;
                                      CStack_940.super_Matrix_dimension_option.dimensions_.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start =
                                           (pointer)((ulong)CStack_940.super_Matrix_dimension_option
                                                            .dimensions_.
                                                                                                                        
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start &
                                                  0xffffffffffffff00);
                                      local_948 = (pool<boost::default_user_allocator_malloc_free> *
                                                  )&PTR__lazy_ostream_0024fea0;
                                      CStack_940.super_Matrix_dimension_option.dimensions_.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_finish =
                                           (pointer)&boost::unit_test::lazy_ostream::inst;
                                      CStack_940.super_Matrix_dimension_option.dimensions_.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                           (pointer)&local_990;
                                      local_9e8 = &local_9ec;
                                      local_9d0 = (char *)((ulong)local_9d0 & 0xffffffffffffff00);
                                      local_9d8 = (undefined4 ****)&PTR__lazy_ostream_0024fea0;
                                      sStack_9c8.pi_ =
                                           (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
                                      local_9c0 = &local_9e8;
                                      boost::test_tools::tt_detail::report_assertion
                                                (&local_968,&local_9b8,&local_980,0x173,1,2,2,
                                                 "mc2.get_column_dimension(6)",&local_948,"2",
                                                 &local_9d8);
                                      boost::detail::shared_count::~shared_count(&sStack_958);
                                      CStack_940.super_Matrix_dimension_option.maxDim_ =
                                           auStack_820._24_4_;
                                      local_948 = (pool<boost::default_user_allocator_malloc_free> *
                                                  )local_828;
                                      local_828 = (undefined1  [8])0x0;
                                      CStack_940.super_Matrix_dimension_option.dimensions_.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start =
                                           (pointer)auStack_820._0_8_;
                                      CStack_940.super_Matrix_dimension_option.dimensions_.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_finish =
                                           (pointer)auStack_820._8_8_;
                                      CStack_940.super_Matrix_dimension_option.dimensions_.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                           (pointer)auStack_820._16_8_;
                                      auStack_820._16_8_ = (_Invoker_type)0x0;
                                      auStack_820._0_8_ = 0;
                                      auStack_820._8_8_ = (_Manager_type)0x0;
                                      auStack_820._24_4_ = 0xffffffff;
                                      CStack_940.super_Chain_vine_swap_option.birthComp_.
                                      super__Function_base._M_functor._M_unused._M_object =
                                           (void *)0x0;
                                      CStack_940.super_Chain_vine_swap_option.birthComp_.
                                      super__Function_base._M_functor._8_8_ = 0;
                                      CStack_940.super_Chain_vine_swap_option.birthComp_.
                                      super__Function_base._M_manager = (_Manager_type)0x0;
                                      CStack_940.super_Chain_vine_swap_option.birthComp_._M_invoker
                                           = p_Stack_7e8;
                                      if (local_7f0 != (_Manager_type)0x0) {
                                        CStack_940.super_Chain_vine_swap_option.birthComp_.
                                        super__Function_base._M_functor._M_unused._M_object =
                                             (void *)auStack_820._32_8_;
                                        CStack_940.super_Chain_vine_swap_option.birthComp_.
                                        super__Function_base._M_functor._8_8_ = uStack_7f8;
                                        CStack_940.super_Chain_vine_swap_option.birthComp_.
                                        super__Function_base._M_manager = local_7f0;
                                        local_7f0 = (_Manager_type)0x0;
                                        p_Stack_7e8 = (_Invoker_type)0x0;
                                      }
                                      CStack_940.super_Chain_vine_swap_option.deathComp_.
                                      super__Function_base._M_functor._M_unused._M_object =
                                           (void *)0x0;
                                      CStack_940.super_Chain_vine_swap_option.deathComp_.
                                      super__Function_base._M_functor._8_8_ = 0;
                                      CStack_940.super_Chain_vine_swap_option.deathComp_.
                                      super__Function_base._M_manager = (_Manager_type)0x0;
                                      CStack_940.super_Chain_vine_swap_option.deathComp_._M_invoker
                                           = p_Stack_7c8;
                                      if (local_7d0 != (_Manager_type)0x0) {
                                        CStack_940.super_Chain_vine_swap_option.deathComp_.
                                        super__Function_base._M_functor._M_unused._M_object =
                                             local_7e0;
                                        CStack_940.super_Chain_vine_swap_option.deathComp_.
                                        super__Function_base._M_functor._8_8_ = uStack_7d8;
                                        CStack_940.super_Chain_vine_swap_option.deathComp_.
                                        super__Function_base._M_manager = local_7d0;
                                        local_7d0 = (_Manager_type)0x0;
                                        p_Stack_7c8 = (_Invoker_type)0x0;
                                      }
                                      CStack_940.super_Chain_representative_cycles_option.
                                      representativeCycles_.
                                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start = local_7c0;
                                      CStack_940.super_Chain_representative_cycles_option.
                                      representativeCycles_.
                                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish = pvStack_7b8;
                                      CStack_940.super_Chain_representative_cycles_option.
                                      representativeCycles_.
                                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage = local_7b0
                                      ;
                                      local_7c0 = (pointer)0x0;
                                      pvStack_7b8 = (pointer)0x0;
                                      local_7b0 = (pointer)0x0;
                                      CStack_940.super_Chain_representative_cycles_option.
                                      birthToCycle_.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start._0_4_ =
                                           (undefined4)local_7a8;
                                      CStack_940.super_Chain_representative_cycles_option.
                                      birthToCycle_.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start._4_4_ =
                                           local_7a8._4_4_;
                                      CStack_940.super_Chain_representative_cycles_option.
                                      birthToCycle_.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_finish._0_4_ =
                                           (undefined4)uStack_7a0;
                                      CStack_940.super_Chain_representative_cycles_option.
                                      birthToCycle_.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_finish._4_4_ =
                                           uStack_7a0._4_4_;
                                      CStack_940.super_Chain_representative_cycles_option.
                                      birthToCycle_.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage = local_798
                                      ;
                                      local_7a8 = 0;
                                      uStack_7a0 = 0;
                                      local_798 = (pointer)0x0;
                                      std::
                                      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                      ::_Hashtable(&CStack_940.matrix_._M_h,auStack_820 + 0x90,
                                                   auStack_820 + 0x90);
                                      std::
                                      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                      ::_Hashtable(&CStack_940.pivotToColumnIndex_._M_h,
                                                   auStack_820 + 200);
                                      CStack_940.colSettings_ = (Column_settings *)local_718;
                                      CStack_940.nextIndex_ = local_720;
                                      local_720 = 0;
                                      local_718 = (pool<boost::default_user_allocator_malloc_free> *
                                                  )0x0;
                                      local_2b8 = 
                                      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                      ;
                                      local_2b0 = "";
                                      local_2c8 = &boost::unit_test::basic_cstring<char_const>::null
                                      ;
                                      local_2c0 = &boost::unit_test::basic_cstring<char_const>::null
                                      ;
                                      boost::unit_test::unit_test_log_t::set_checkpoint
                                                (boost::unit_test::(anonymous_namespace)::
                                                 unit_test_log,&local_2b8,0x177);
                                      local_960 = local_960 & 0xffffffffffffff00;
                                      local_968 = (undefined4 ***)&PTR__lazy_ostream_0024fee0;
                                      sStack_958.pi_ =
                                           (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
                                      local_950 = "";
                                      local_9ec = (int)CStack_940.matrix_._M_h._M_element_count;
                                      local_994 = 7;
                                      local_978 = (char *)0x0;
                                      sStack_970.pi_ = (sp_counted_base *)0x0;
                                      local_990 = (undefined4 **)0x209319;
                                      local_988 = "";
                                      local_9e8 = &local_9ec;
                                      local_9d0 = (char *)((ulong)local_9d0 & 0xffffffffffffff00);
                                      local_9d8 = (undefined4 ****)&PTR__lazy_ostream_0024fe50;
                                      sStack_9c8.pi_ =
                                           (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
                                      local_9c0 = &local_9e8;
                                      local_9b0 = (char *)((ulong)local_9b0 & 0xffffffffffffff00);
                                      local_9b8 = &PTR__lazy_ostream_0024fea0;
                                      local_9a8 = &boost::unit_test::lazy_ostream::inst;
                                      local_9a0 = &local_9e0;
                                      local_9e0 = &local_994;
                                      local_980._0_1_ =
                                           (int)CStack_940.matrix_._M_h._M_element_count == 7;
                                      boost::test_tools::tt_detail::report_assertion();
                                      boost::detail::shared_count::~shared_count(&sStack_970);
                                      local_2d8 = 
                                      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                      ;
                                      local_2d0 = "";
                                      local_2e8 = &boost::unit_test::basic_cstring<char_const>::null
                                      ;
                                      local_2e0 = &boost::unit_test::basic_cstring<char_const>::null
                                      ;
                                      boost::unit_test::unit_test_log_t::set_checkpoint
                                                (boost::unit_test::(anonymous_namespace)::
                                                 unit_test_log,&local_2d8,0x178);
                                      local_960 = local_960 & 0xffffffffffffff00;
                                      local_968 = (undefined4 ***)&PTR__lazy_ostream_0024fee0;
                                      sStack_958.pi_ =
                                           (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
                                      local_950 = "";
                                      auVar11._8_8_ = 0;
                                      auVar11._0_8_ = CStack_940.matrix_._M_h._M_bucket_count;
                                      uVar21 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(2)) % auVar11,0)
                                      ;
                                      if (CStack_940.matrix_._M_h._M_buckets[uVar21 & 0xffffffff] !=
                                          (__node_base_ptr)0x0) {
                                        p_Var3 = CStack_940.matrix_._M_h._M_buckets
                                                 [uVar21 & 0xffffffff]->_M_nxt;
                                        uVar1 = *(uint *)&p_Var3[1]._M_nxt;
                                        do {
                                          if (uVar1 == 2) {
                                            local_9ec = *(int *)&p_Var3[2]._M_nxt;
                                            local_994 = 0;
                                            local_980._0_1_ = local_9ec == 0;
                                            local_978 = (char *)0x0;
                                            sStack_970.pi_ = (sp_counted_base *)0x0;
                                            local_990 = (undefined4 **)0x209319;
                                            local_988 = "";
                                            local_9e8 = &local_9ec;
                                            local_9d0 = (char *)((ulong)local_9d0 &
                                                                0xffffffffffffff00);
                                            local_9d8 = (undefined4 ****)&PTR__lazy_ostream_0024fea0
                                            ;
                                            sStack_9c8.pi_ =
                                                 (sp_counted_base *)
                                                 &boost::unit_test::lazy_ostream::inst;
                                            local_9c0 = &local_9e8;
                                            local_9b0 = (char *)((ulong)local_9b0 &
                                                                0xffffffffffffff00);
                                            local_9b8 = &PTR__lazy_ostream_0024fea0;
                                            local_9a8 = &boost::unit_test::lazy_ostream::inst;
                                            local_9a0 = &local_9e0;
                                            local_9e0 = &local_994;
                                            boost::test_tools::tt_detail::report_assertion
                                                      (&local_980,&local_968,&local_990,0x178,1,2,2,
                                                       "mm.get_column_dimension(2)",&local_9d8,"0",
                                                       &local_9b8);
                                            boost::detail::shared_count::~shared_count(&sStack_970);
                                            local_2f8 = 
                                            "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                            ;
                                            local_2f0 = "";
                                            local_308 = &boost::unit_test::basic_cstring<char_const>
                                                         ::null;
                                            local_300 = &boost::unit_test::basic_cstring<char_const>
                                                         ::null;
                                            boost::unit_test::unit_test_log_t::set_checkpoint
                                                      (boost::unit_test::(anonymous_namespace)::
                                                       unit_test_log,&local_2f8,0x179);
                                            local_960 = local_960 & 0xffffffffffffff00;
                                            local_968 = (undefined4 ***)&PTR__lazy_ostream_0024fee0;
                                            sStack_958.pi_ =
                                                 (sp_counted_base *)
                                                 &boost::unit_test::lazy_ostream::inst;
                                            local_950 = "";
                                            auVar12._8_8_ = 0;
                                            auVar12._0_8_ = CStack_940.matrix_._M_h._M_bucket_count;
                                            uVar21 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(6)) %
                                                            auVar12,0);
                                            if (CStack_940.matrix_._M_h._M_buckets
                                                [uVar21 & 0xffffffff] != (__node_base_ptr)0x0) {
                                              p_Var3 = CStack_940.matrix_._M_h._M_buckets
                                                       [uVar21 & 0xffffffff]->_M_nxt;
                                              uVar1 = *(uint *)&p_Var3[1]._M_nxt;
                                              do {
                                                if (uVar1 == 6) {
                                                  local_9ec = *(int *)&p_Var3[2]._M_nxt;
                                                  local_994 = 2;
                                                  local_980._0_1_ = local_9ec == 2;
                                                  local_978 = (char *)0x0;
                                                  sStack_970.pi_ = (sp_counted_base *)0x0;
                                                  local_990 = (undefined4 **)0x209319;
                                                  local_988 = "";
                                                  local_9e8 = &local_9ec;
                                                  local_9d0 = (char *)((ulong)local_9d0 &
                                                                      0xffffffffffffff00);
                                                  local_9d8 = (undefined4 ****)
                                                              &PTR__lazy_ostream_0024fea0;
                                                  sStack_9c8.pi_ =
                                                       (sp_counted_base *)
                                                       &boost::unit_test::lazy_ostream::inst;
                                                  local_9c0 = &local_9e8;
                                                  local_9b0 = (char *)((ulong)local_9b0 &
                                                                      0xffffffffffffff00);
                                                  local_9b8 = &PTR__lazy_ostream_0024fea0;
                                                  local_9a8 = &boost::unit_test::lazy_ostream::inst;
                                                  local_9a0 = &local_9e0;
                                                  local_9e0 = &local_994;
                                                  boost::test_tools::tt_detail::report_assertion
                                                            (&local_980,&local_968,&local_990,0x179,
                                                             1,2,2,"mm.get_column_dimension(6)",
                                                             &local_9d8,"2",&local_9b8);
                                                  boost::detail::shared_count::~shared_count
                                                            (&sStack_970);
                                                  local_318 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                                  ;
                                                  local_310 = "";
                                                  local_328 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_320 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,&local_318,0x17a);
                                                  local_960 = local_960 & 0xffffffffffffff00;
                                                  local_968 = (undefined4 ***)
                                                              &PTR__lazy_ostream_0024fee0;
                                                  sStack_958.pi_ =
                                                       (sp_counted_base *)
                                                       &boost::unit_test::lazy_ostream::inst;
                                                  local_950 = "";
                                                  local_9ec = (int)local_790._M_element_count;
                                                  local_980._0_1_ =
                                                       (int)local_790._M_element_count == 0;
                                                  local_994 = 0;
                                                  local_978 = (char *)0x0;
                                                  sStack_970.pi_ = (sp_counted_base *)0x0;
                                                  local_990 = (undefined4 **)0x209319;
                                                  local_988 = "";
                                                  local_9e8 = &local_9ec;
                                                  local_9d0 = (char *)((ulong)local_9d0 &
                                                                      0xffffffffffffff00);
                                                  local_9d8 = (undefined4 ****)
                                                              &PTR__lazy_ostream_0024fe50;
                                                  sStack_9c8.pi_ =
                                                       (sp_counted_base *)
                                                       &boost::unit_test::lazy_ostream::inst;
                                                  local_9c0 = &local_9e8;
                                                  local_9b0 = (char *)((ulong)local_9b0 &
                                                                      0xffffffffffffff00);
                                                  local_9b8 = &PTR__lazy_ostream_0024fea0;
                                                  local_9a8 = &boost::unit_test::lazy_ostream::inst;
                                                  local_9a0 = &local_9e0;
                                                  local_9e0 = &local_994;
                                                  boost::test_tools::tt_detail::report_assertion();
                                                  boost::detail::shared_count::~shared_count
                                                            (&sStack_970);
                                                  Gudhi::persistence_matrix::swap
                                                            (&CStack_940,
                                                             (
                                                  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>
                                                  *)(local_828 + 8));
                                                  ppVar15 = local_948;
                                                  local_948 = (
                                                  pool<boost::default_user_allocator_malloc_free> *)
                                                  local_828;
                                                  local_828 = (undefined1  [8])ppVar15;
                                                  local_338 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                                  ;
                                                  local_330 = "";
                                                  local_348 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_340 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,&local_338,0x17e);
                                                  local_960 = local_960 & 0xffffffffffffff00;
                                                  local_968 = (undefined4 ***)
                                                              &PTR__lazy_ostream_0024fee0;
                                                  sStack_958.pi_ =
                                                       (sp_counted_base *)
                                                       &boost::unit_test::lazy_ostream::inst;
                                                  local_950 = "";
                                                  local_9ec = (int)CStack_940.matrix_._M_h.
                                                                   _M_element_count;
                                                  local_980._0_1_ =
                                                       (int)CStack_940.matrix_._M_h._M_element_count
                                                       == 0;
                                                  local_994 = 0;
                                                  local_978 = (char *)0x0;
                                                  sStack_970.pi_ = (sp_counted_base *)0x0;
                                                  local_990 = (undefined4 **)0x209319;
                                                  local_988 = "";
                                                  local_9e8 = &local_9ec;
                                                  local_9d0 = (char *)((ulong)local_9d0 &
                                                                      0xffffffffffffff00);
                                                  local_9d8 = (undefined4 ****)
                                                              &PTR__lazy_ostream_0024fe50;
                                                  sStack_9c8.pi_ =
                                                       (sp_counted_base *)
                                                       &boost::unit_test::lazy_ostream::inst;
                                                  local_9c0 = &local_9e8;
                                                  local_9b0 = (char *)((ulong)local_9b0 &
                                                                      0xffffffffffffff00);
                                                  local_9b8 = &PTR__lazy_ostream_0024fea0;
                                                  local_9a8 = &boost::unit_test::lazy_ostream::inst;
                                                  local_9a0 = &local_9e0;
                                                  local_9e0 = &local_994;
                                                  boost::test_tools::tt_detail::report_assertion();
                                                  boost::detail::shared_count::~shared_count
                                                            (&sStack_970);
                                                  local_358 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                                  ;
                                                  local_350 = "";
                                                  local_368 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_360 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,&local_358,0x17f);
                                                  local_960 = local_960 & 0xffffffffffffff00;
                                                  local_968 = (undefined4 ***)
                                                              &PTR__lazy_ostream_0024fee0;
                                                  sStack_958.pi_ =
                                                       (sp_counted_base *)
                                                       &boost::unit_test::lazy_ostream::inst;
                                                  local_950 = "";
                                                  local_9ec = (int)local_790._M_element_count;
                                                  local_980._0_1_ =
                                                       (int)local_790._M_element_count == 7;
                                                  local_994 = 7;
                                                  local_978 = (char *)0x0;
                                                  sStack_970.pi_ = (sp_counted_base *)0x0;
                                                  local_990 = (undefined4 **)0x209319;
                                                  local_988 = "";
                                                  local_9e8 = &local_9ec;
                                                  local_9d0 = (char *)((ulong)local_9d0 &
                                                                      0xffffffffffffff00);
                                                  local_9d8 = (undefined4 ****)
                                                              &PTR__lazy_ostream_0024fe50;
                                                  sStack_9c8.pi_ =
                                                       (sp_counted_base *)
                                                       &boost::unit_test::lazy_ostream::inst;
                                                  local_9c0 = &local_9e8;
                                                  local_9b0 = (char *)((ulong)local_9b0 &
                                                                      0xffffffffffffff00);
                                                  local_9b8 = &PTR__lazy_ostream_0024fea0;
                                                  local_9a8 = &boost::unit_test::lazy_ostream::inst;
                                                  local_9a0 = &local_9e0;
                                                  local_9e0 = &local_994;
                                                  boost::test_tools::tt_detail::report_assertion();
                                                  boost::detail::shared_count::~shared_count
                                                            (&sStack_970);
                                                  local_378 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                                  ;
                                                  local_370 = "";
                                                  local_388 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_380 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,&local_378,0x180);
                                                  local_960 = local_960 & 0xffffffffffffff00;
                                                  local_968 = (undefined4 ***)
                                                              &PTR__lazy_ostream_0024fee0;
                                                  sStack_958.pi_ =
                                                       (sp_counted_base *)
                                                       &boost::unit_test::lazy_ostream::inst;
                                                  local_950 = "";
                                                  auVar13._8_8_ = 0;
                                                  auVar13._0_8_ = local_790._M_bucket_count;
                                                  uVar21 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(2))
                                                                  % auVar13,0);
                                                  plVar2 = *(long **)((long)local_790._M_buckets +
                                                                     (uVar21 & 0xffffffff) * 8);
                                                  if (plVar2 != (long *)0x0) {
                                                    plVar2 = (long *)*plVar2;
                                                    uVar1 = *(uint *)(plVar2 + 1);
                                                    do {
                                                      if (uVar1 == 2) {
                                                        local_9ec = (int)plVar2[2];
                                                        local_994 = 0;
                                                        local_980._0_1_ = local_9ec == 0;
                                                        local_978 = (char *)0x0;
                                                        sStack_970.pi_ = (sp_counted_base *)0x0;
                                                        local_990 = (undefined4 **)0x209319;
                                                        local_988 = "";
                                                        local_9e8 = &local_9ec;
                                                        local_9d0 = (char *)((ulong)local_9d0 &
                                                                            0xffffffffffffff00);
                                                        local_9d8 = (undefined4 ****)
                                                                    &PTR__lazy_ostream_0024fea0;
                                                        sStack_9c8.pi_ =
                                                             (sp_counted_base *)
                                                             &boost::unit_test::lazy_ostream::inst;
                                                        local_9c0 = &local_9e8;
                                                        local_9b0 = (char *)((ulong)local_9b0 &
                                                                            0xffffffffffffff00);
                                                        local_9b8 = &PTR__lazy_ostream_0024fea0;
                                                        local_9a8 = &boost::unit_test::lazy_ostream
                                                                     ::inst;
                                                        local_9a0 = &local_9e0;
                                                        local_9e0 = &local_994;
                                                        boost::test_tools::tt_detail::
                                                        report_assertion(&local_980,&local_968,
                                                                         &local_990,0x180,1,2,2,
                                                                                                                                                  
                                                  "mb.get_column_dimension(2)",&local_9d8,"0",
                                                  &local_9b8);
                                                  boost::detail::shared_count::~shared_count
                                                            (&sStack_970);
                                                  local_398 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                                  ;
                                                  local_390 = "";
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,&local_398,0x181);
                                                  local_960 = local_960 & 0xffffffffffffff00;
                                                  local_968 = (undefined4 ***)
                                                              &PTR__lazy_ostream_0024fee0;
                                                  sStack_958.pi_ =
                                                       (sp_counted_base *)
                                                       &boost::unit_test::lazy_ostream::inst;
                                                  local_950 = "";
                                                  auVar14._8_8_ = 0;
                                                  auVar14._0_8_ = local_790._M_bucket_count;
                                                  uVar21 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(6))
                                                                  % auVar14,0);
                                                  plVar2 = *(long **)((long)local_790._M_buckets +
                                                                     (uVar21 & 0xffffffff) * 8);
                                                  if (plVar2 != (long *)0x0) {
                                                    plVar2 = (long *)*plVar2;
                                                    uVar1 = *(uint *)(plVar2 + 1);
                                                    do {
                                                      if (uVar1 == 6) {
                                                        local_9ec = (int)plVar2[2];
                                                        local_994 = 2;
                                                        local_980 = (char *)CONCAT71(local_980._1_7_
                                                                                     ,local_9ec == 2
                                                                                    );
                                                        local_978 = (char *)0x0;
                                                        sStack_970.pi_ = (sp_counted_base *)0x0;
                                                        local_990 = (undefined4 **)0x209319;
                                                        local_988 = "";
                                                        local_9e8 = &local_9ec;
                                                        local_9d0 = (char *)((ulong)local_9d0 &
                                                                            0xffffffffffffff00);
                                                        local_9d8 = (undefined4 ****)
                                                                    &PTR__lazy_ostream_0024fea0;
                                                        sStack_9c8.pi_ =
                                                             (sp_counted_base *)
                                                             &boost::unit_test::lazy_ostream::inst;
                                                        local_9c0 = &local_9e8;
                                                        local_9b0 = (char *)((ulong)local_9b0 &
                                                                            0xffffffffffffff00);
                                                        local_9b8 = &PTR__lazy_ostream_0024fea0;
                                                        local_9a8 = &boost::unit_test::lazy_ostream
                                                                     ::inst;
                                                        local_9a0 = &local_9e0;
                                                        local_9e0 = &local_994;
                                                        boost::test_tools::tt_detail::
                                                        report_assertion();
                                                        boost::detail::shared_count::~shared_count
                                                                  (&sStack_970);
                                                        ppVar15 = local_948;
                                                        std::
                                                  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                                  ::clear(&CStack_940.matrix_._M_h);
                                                  while (CStack_940.pivotToColumnIndex_._M_h.
                                                         _M_before_begin._M_nxt !=
                                                         (_Hash_node_base *)0x0) {
                                                    p_Var3 = (CStack_940.pivotToColumnIndex_._M_h.
                                                              _M_before_begin._M_nxt)->_M_nxt;
                                                    operator_delete(CStack_940.pivotToColumnIndex_.
                                                                    _M_h._M_before_begin._M_nxt,0x10
                                                                   );
                                                    CStack_940.pivotToColumnIndex_._M_h.
                                                    _M_before_begin._M_nxt = p_Var3;
                                                  }
                                                  memset(CStack_940.pivotToColumnIndex_._M_h.
                                                         _M_buckets,0,
                                                         CStack_940.pivotToColumnIndex_._M_h.
                                                         _M_bucket_count << 3);
                                                  ppVar16 = local_948;
                                                  CStack_940.pivotToColumnIndex_._M_h.
                                                  _M_before_begin._M_nxt = (_Hash_node_base *)0x0;
                                                  CStack_940.pivotToColumnIndex_._M_h.
                                                  _M_element_count = 0;
                                                  CStack_940.nextIndex_ = 0;
                                                  CStack_940.colSettings_ =
                                                       (Column_settings *)ppVar15;
                                                  if (local_948 !=
                                                      (
                                                  pool<boost::default_user_allocator_malloc_free> *)
                                                  0x0) {
                                                    boost::
                                                  pool<boost::default_user_allocator_malloc_free>::
                                                  purge_memory(local_948);
                                                  }
                                                  operator_delete(ppVar16,0x38);
                                                  Gudhi::persistence_matrix::
                                                  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>
                                                  ::~Chain_matrix(&CStack_940);
                                                  pCVar19 = mc2.colSettings_;
                                                  std::
                                                  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                                  ::clear(&mc2.matrix_.matrix_._M_h);
                                                  while (mc2.matrix_.pivotToColumnIndex_._M_h.
                                                         _M_before_begin._M_nxt !=
                                                         (_Hash_node_base *)0x0) {
                                                    p_Var3 = (mc2.matrix_.pivotToColumnIndex_._M_h.
                                                              _M_before_begin._M_nxt)->_M_nxt;
                                                    operator_delete(mc2.matrix_.pivotToColumnIndex_.
                                                                    _M_h._M_before_begin._M_nxt,0x10
                                                                   );
                                                    mc2.matrix_.pivotToColumnIndex_._M_h.
                                                    _M_before_begin._M_nxt = p_Var3;
                                                  }
                                                  memset(mc2.matrix_.pivotToColumnIndex_._M_h.
                                                         _M_buckets,0,
                                                         mc2.matrix_.pivotToColumnIndex_._M_h.
                                                         _M_bucket_count << 3);
                                                  pCVar20 = mc2.colSettings_;
                                                  mc2.matrix_.pivotToColumnIndex_._M_h.
                                                  _M_before_begin._M_nxt = (_Hash_node_base *)0x0;
                                                  mc2.matrix_.pivotToColumnIndex_._M_h.
                                                  _M_element_count = 0;
                                                  mc2.matrix_.nextIndex_ = 0;
                                                  mc2.matrix_.colSettings_ = pCVar19;
                                                  if (mc2.colSettings_ != (Column_settings *)0x0) {
                                                    boost::
                                                  pool<boost::default_user_allocator_malloc_free>::
                                                  purge_memory((
                                                  pool<boost::default_user_allocator_malloc_free> *)
                                                  mc2.colSettings_);
                                                  }
                                                  operator_delete(pCVar20,0x38);
                                                  Gudhi::persistence_matrix::
                                                  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>
                                                  ::~Chain_matrix(&mc2.matrix_);
                                                  pCVar19 = mc1.colSettings_;
                                                  std::
                                                  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                                  ::clear(&mc1.matrix_.matrix_._M_h);
                                                  while (mc1.matrix_.pivotToColumnIndex_._M_h.
                                                         _M_before_begin._M_nxt !=
                                                         (_Hash_node_base *)0x0) {
                                                    p_Var3 = (mc1.matrix_.pivotToColumnIndex_._M_h.
                                                              _M_before_begin._M_nxt)->_M_nxt;
                                                    operator_delete(mc1.matrix_.pivotToColumnIndex_.
                                                                    _M_h._M_before_begin._M_nxt,0x10
                                                                   );
                                                    mc1.matrix_.pivotToColumnIndex_._M_h.
                                                    _M_before_begin._M_nxt = p_Var3;
                                                  }
                                                  memset(mc1.matrix_.pivotToColumnIndex_._M_h.
                                                         _M_buckets,0,
                                                         mc1.matrix_.pivotToColumnIndex_._M_h.
                                                         _M_bucket_count << 3);
                                                  pCVar20 = mc1.colSettings_;
                                                  mc1.matrix_.pivotToColumnIndex_._M_h.
                                                  _M_before_begin._M_nxt = (_Hash_node_base *)0x0;
                                                  mc1.matrix_.pivotToColumnIndex_._M_h.
                                                  _M_element_count = 0;
                                                  mc1.matrix_.nextIndex_ = 0;
                                                  mc1.matrix_.colSettings_ = pCVar19;
                                                  if (mc1.colSettings_ != (Column_settings *)0x0) {
                                                    boost::
                                                  pool<boost::default_user_allocator_malloc_free>::
                                                  purge_memory((
                                                  pool<boost::default_user_allocator_malloc_free> *)
                                                  mc1.colSettings_);
                                                  }
                                                  operator_delete(pCVar20,0x38);
                                                  Gudhi::persistence_matrix::
                                                  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>
                                                  ::~Chain_matrix(&mc1.matrix_);
                                                  pCVar19 = mr.colSettings_;
                                                  std::
                                                  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                                  ::clear(&mr.matrix_.matrix_._M_h);
                                                  while (mr.matrix_.pivotToColumnIndex_._M_h.
                                                         _M_before_begin._M_nxt !=
                                                         (_Hash_node_base *)0x0) {
                                                    p_Var3 = (mr.matrix_.pivotToColumnIndex_._M_h.
                                                              _M_before_begin._M_nxt)->_M_nxt;
                                                    operator_delete(mr.matrix_.pivotToColumnIndex_.
                                                                    _M_h._M_before_begin._M_nxt,0x10
                                                                   );
                                                    mr.matrix_.pivotToColumnIndex_._M_h.
                                                    _M_before_begin._M_nxt = p_Var3;
                                                  }
                                                  memset(mr.matrix_.pivotToColumnIndex_._M_h.
                                                         _M_buckets,0,
                                                         mr.matrix_.pivotToColumnIndex_._M_h.
                                                         _M_bucket_count << 3);
                                                  pCVar20 = mr.colSettings_;
                                                  mr.matrix_.pivotToColumnIndex_._M_h.
                                                  _M_before_begin._M_nxt = (_Hash_node_base *)0x0;
                                                  mr.matrix_.pivotToColumnIndex_._M_h.
                                                  _M_element_count = 0;
                                                  mr.matrix_.nextIndex_ = 0;
                                                  mr.matrix_.colSettings_ = pCVar19;
                                                  if (mr.colSettings_ != (Column_settings *)0x0) {
                                                    boost::
                                                  pool<boost::default_user_allocator_malloc_free>::
                                                  purge_memory((
                                                  pool<boost::default_user_allocator_malloc_free> *)
                                                  mr.colSettings_);
                                                  }
                                                  operator_delete(pCVar20,0x38);
                                                  Gudhi::persistence_matrix::
                                                  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>
                                                  ::~Chain_matrix(&mr.matrix_);
                                                  auVar17 = local_828;
                                                  std::
                                                  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                                  ::clear((
                                                  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                                  *)(auStack_820 + 0x90));
                                                  while (local_748 != (undefined8 *)0x0) {
                                                    puVar4 = (undefined8 *)*local_748;
                                                    operator_delete(local_748,0x10);
                                                    local_748 = puVar4;
                                                  }
                                                  memset(local_758,0,local_750 << 3);
                                                  auVar18 = local_828;
                                                  local_748 = (undefined8 *)0x0;
                                                  uStack_740 = 0;
                                                  local_720 = 0;
                                                  local_718 = (
                                                  pool<boost::default_user_allocator_malloc_free> *)
                                                  auVar17;
                                                  if (local_828 != (undefined1  [8])0x0) {
                                                    boost::
                                                  pool<boost::default_user_allocator_malloc_free>::
                                                  purge_memory((
                                                  pool<boost::default_user_allocator_malloc_free> *)
                                                  local_828);
                                                  }
                                                  operator_delete((void *)auVar18,0x38);
                                                  Gudhi::persistence_matrix::
                                                  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>
                                                  ::~Chain_matrix((
                                                  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>
                                                  *)(local_828 + 8));
                                                  pCVar19 = m.colSettings_;
                                                  std::
                                                  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                                  ::clear(&m.matrix_.matrix_._M_h);
                                                  while (m.matrix_.pivotToColumnIndex_._M_h.
                                                         _M_before_begin._M_nxt !=
                                                         (_Hash_node_base *)0x0) {
                                                    p_Var3 = (m.matrix_.pivotToColumnIndex_._M_h.
                                                              _M_before_begin._M_nxt)->_M_nxt;
                                                    operator_delete(m.matrix_.pivotToColumnIndex_.
                                                                    _M_h._M_before_begin._M_nxt,0x10
                                                                   );
                                                    m.matrix_.pivotToColumnIndex_._M_h.
                                                    _M_before_begin._M_nxt = p_Var3;
                                                  }
                                                  memset(m.matrix_.pivotToColumnIndex_._M_h.
                                                         _M_buckets,0,
                                                         m.matrix_.pivotToColumnIndex_._M_h.
                                                         _M_bucket_count << 3);
                                                  pCVar20 = m.colSettings_;
                                                  m.matrix_.pivotToColumnIndex_._M_h._M_before_begin
                                                  ._M_nxt = (_Hash_node_base *)0x0;
                                                  m.matrix_.pivotToColumnIndex_._M_h.
                                                  _M_element_count = 0;
                                                  m.matrix_.nextIndex_ = 0;
                                                  m.matrix_.colSettings_ = pCVar19;
                                                  if (m.colSettings_ != (Column_settings *)0x0) {
                                                    boost::
                                                  pool<boost::default_user_allocator_malloc_free>::
                                                  purge_memory((
                                                  pool<boost::default_user_allocator_malloc_free> *)
                                                  m.colSettings_);
                                                  }
                                                  operator_delete(pCVar20,0x38);
                                                  Gudhi::persistence_matrix::
                                                  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>
                                                  ::~Chain_matrix(&m.matrix_);
                                                  std::
                                                  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                                  ::~vector(&ordered_boundaries);
                                                  return;
                                                  }
                                                  plVar2 = (long *)*plVar2;
                                                  } while ((plVar2 != (long *)0x0) &&
                                                          (uVar1 = *(uint *)(plVar2 + 1),
                                                          (ulong)uVar1 % local_790._M_bucket_count
                                                          == uVar21));
                                                  }
                                                  std::__throw_out_of_range("_Map_base::at");
                                                  }
                                                  plVar2 = (long *)*plVar2;
                                                  } while ((plVar2 != (long *)0x0) &&
                                                          (uVar1 = *(uint *)(plVar2 + 1),
                                                          (ulong)uVar1 % local_790._M_bucket_count
                                                          == uVar21));
                                                  }
                                                  std::__throw_out_of_range("_Map_base::at");
                                                }
                                                p_Var3 = p_Var3->_M_nxt;
                                              } while ((p_Var3 != (_Hash_node_base *)0x0) &&
                                                      (uVar1 = *(uint *)&p_Var3[1]._M_nxt,
                                                      (ulong)uVar1 %
                                                      CStack_940.matrix_._M_h._M_bucket_count ==
                                                      uVar21));
                                            }
                                            std::__throw_out_of_range("_Map_base::at");
                                          }
                                          p_Var3 = p_Var3->_M_nxt;
                                        } while ((p_Var3 != (_Hash_node_base *)0x0) &&
                                                (uVar1 = *(uint *)&p_Var3[1]._M_nxt,
                                                (ulong)uVar1 %
                                                CStack_940.matrix_._M_h._M_bucket_count == uVar21));
                                      }
                                      std::__throw_out_of_range("_Map_base::at");
                                    }
                                    p_Var3 = p_Var3->_M_nxt;
                                  } while ((p_Var3 != (_Hash_node_base *)0x0) &&
                                          (uVar1 = *(uint *)&p_Var3[1]._M_nxt,
                                          (ulong)uVar1 % mc2.matrix_.matrix_._M_h._M_bucket_count ==
                                          uVar21));
                                }
                                std::__throw_out_of_range("_Map_base::at");
                              }
                              p_Var3 = p_Var3->_M_nxt;
                            } while ((p_Var3 != (_Hash_node_base *)0x0) &&
                                    (uVar1 = *(uint *)&p_Var3[1]._M_nxt,
                                    (ulong)uVar1 % mc2.matrix_.matrix_._M_h._M_bucket_count ==
                                    uVar21));
                          }
                          std::__throw_out_of_range("_Map_base::at");
                        }
                        p_Var3 = p_Var3->_M_nxt;
                      } while ((p_Var3 != (_Hash_node_base *)0x0) &&
                              (uVar1 = *(uint *)&p_Var3[1]._M_nxt,
                              (ulong)uVar1 % mc1.matrix_.matrix_._M_h._M_bucket_count == uVar21));
                    }
                    std::__throw_out_of_range("_Map_base::at");
                  }
                  p_Var3 = p_Var3->_M_nxt;
                } while ((p_Var3 != (_Hash_node_base *)0x0) &&
                        (uVar1 = *(uint *)&p_Var3[1]._M_nxt,
                        (ulong)uVar1 % mc1.matrix_.matrix_._M_h._M_bucket_count == uVar21));
              }
              std::__throw_out_of_range("_Map_base::at");
            }
            plVar2 = (long *)*plVar2;
          } while ((plVar2 != (long *)0x0) &&
                  (uVar1 = *(uint *)(plVar2 + 1), (ulong)uVar1 % local_790._M_bucket_count == uVar21
                  ));
        }
        std::__throw_out_of_range("_Map_base::at");
      }
      plVar2 = (long *)*plVar2;
    } while ((plVar2 != (long *)0x0) &&
            (uVar1 = *(uint *)(plVar2 + 1), (ulong)uVar1 % local_790._M_bucket_count == uVar21));
  }
  std::__throw_out_of_range("_Map_base::at");
}

Assistant:

void test_chain_constructors() {
  auto ordered_boundaries = build_simple_boundary_matrix<typename Matrix::Column>();

  // default constructor
  Matrix m(birth_comp, death_comp);
  BOOST_CHECK_EQUAL(m.get_number_of_columns(), 0);

  // constructor from given @ref boundarymatrix "boundary matrix"
  Matrix mb(ordered_boundaries, birth_comp, death_comp, 5);
  BOOST_CHECK_EQUAL(mb.get_number_of_columns(), 7);
  BOOST_CHECK_EQUAL(mb.get_column_dimension(2), 0);
  BOOST_CHECK_EQUAL(mb.get_column_dimension(6), 2);

  // constructor reserving column space
  Matrix mr(5, birth_comp, death_comp);
  BOOST_CHECK_EQUAL(mr.get_number_of_columns(), 0);

  // copy constructor
  Matrix mc1(mb);
  Matrix mc2 = mb;
  BOOST_CHECK_EQUAL(mc1.get_number_of_columns(), 7);
  BOOST_CHECK_EQUAL(mc1.get_column_dimension(2), 0);
  BOOST_CHECK_EQUAL(mc1.get_column_dimension(6), 2);
  BOOST_CHECK_EQUAL(mc2.get_number_of_columns(), 7);
  BOOST_CHECK_EQUAL(mc2.get_column_dimension(2), 0);
  BOOST_CHECK_EQUAL(mc2.get_column_dimension(6), 2);

  // move constructor
  Matrix mm(std::move(mb));
  BOOST_CHECK_EQUAL(mm.get_number_of_columns(), 7);
  BOOST_CHECK_EQUAL(mm.get_column_dimension(2), 0);
  BOOST_CHECK_EQUAL(mm.get_column_dimension(6), 2);
  BOOST_CHECK_EQUAL(mb.get_number_of_columns(), 0);

  // swap
  swap(mm, mb);
  BOOST_CHECK_EQUAL(mm.get_number_of_columns(), 0);
  BOOST_CHECK_EQUAL(mb.get_number_of_columns(), 7);
  BOOST_CHECK_EQUAL(mb.get_column_dimension(2), 0);
  BOOST_CHECK_EQUAL(mb.get_column_dimension(6), 2);
}